

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O1

Gia_Man_t * Cec_ManFraSpecReduction(Cec_ManFra_t *p)

{
  Gia_Rpr_t GVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Rpr_t *pGVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  undefined4 *__s;
  void *__ptr;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  size_t __nmemb;
  ulong uVar16;
  long lVar17;
  
  Gia_ManSetPhase(p->pAig);
  p->vXorNodes->nSize = 0;
  if (p->pPars->nLevelMax != 0) {
    Gia_ManLevelNum(p->pAig);
  }
  p_00 = Gia_ManStart(p->pAig->nObjs);
  pGVar11 = p->pAig;
  pcVar2 = pGVar11->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = pGVar11->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  Gia_ManHashAlloc(p_00);
  __nmemb = (size_t)p->pAig->nObjs;
  sVar7 = __nmemb * 4;
  __s = (undefined4 *)malloc(sVar7);
  memset(__s,0xff,sVar7);
  __ptr = calloc(__nmemb,4);
  *__s = 0;
  pGVar11 = p->pAig;
  if (1 < pGVar11->nObjs) {
    lVar17 = 0x100000000;
    uVar16 = 1;
    lVar14 = 0xc;
    do {
      pGVar3 = pGVar11->pObjs;
      uVar10 = *(ulong *)(&pGVar3->field_0x0 + lVar14);
      uVar5 = (uint)uVar10;
      if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_00655a4e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_00655a4e;
        __s[uVar16] = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      }
      else if ((-1 < (int)uVar5 || (~uVar5 & 0x1fffffff) == 0) &&
              (uVar5 = *(uint *)((long)__s +
                                ((long)((ulong)(uVar5 & 0x1fffffff) * -0x100000000 + lVar17) >> 0x1e
                                )), uVar5 != 0xffffffff)) {
        uVar12 = (uint)(uVar10 >> 0x20);
        uVar13 = *(uint *)((long)__s +
                          ((long)((ulong)(uVar12 & 0x1fffffff) * -0x100000000 + lVar17) >> 0x1e));
        if (uVar13 != 0xffffffff) {
          if (((int)uVar5 < 0) || ((int)uVar13 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar10 >> 0x1d) & 1,uVar13 ^ uVar12 >> 0x1d & 1
                                );
          __s[uVar16] = uVar5;
          iVar6 = *(int *)((long)__ptr +
                          ((long)((*(ulong *)(&pGVar3->field_0x0 + lVar14) & 0x1fffffff) *
                                  -0x100000000 + lVar17) >> 0x1e));
          iVar15 = *(int *)((long)__ptr +
                           ((long)((*(ulong *)(&pGVar3->field_0x0 + lVar14) >> 0x20 & 0x1fffffff) *
                                   -0x100000000 + lVar17) >> 0x1e));
          if (iVar15 < iVar6) {
            iVar15 = iVar6;
          }
          *(int *)((long)__ptr + uVar16 * 4) = iVar15;
          GVar1 = p->pAig->pReprs[uVar16];
          uVar10 = (ulong)(uint)GVar1 & 0xfffffff;
          if ((GVar1._3_1_ >> 5 & 1) == 0 && uVar10 != 0xfffffff) {
            if (uVar16 <= uVar10) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                            ,0x50,"Gia_Man_t *Cec_ManFraSpecReduction(Cec_ManFra_t *)");
            }
            uVar13 = __s[uVar10];
            if (uVar13 != 0xffffffff) {
              if (((int)uVar5 < 0) || ((int)uVar13 < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x133,"int Abc_LitRegular(int)");
              }
              if ((1 < (uVar13 ^ uVar5)) &&
                 ((p->pPars->nLevelMax == 0 ||
                  ((iVar6 = Gia_ObjLevelId(p->pAig,(int)uVar16), iVar6 <= p->pPars->nLevelMax &&
                   (iVar6 = Gia_ObjLevelId(p->pAig,uVar13 >> 1), iVar6 <= p->pPars->nLevelMax))))))
              {
                if (p->pPars->fDualOut == 0) {
LAB_006558d1:
                  pGVar9 = Gia_ManObj(p->pAig,(uint)p->pAig->pReprs[uVar16] & 0xfffffff);
                  uVar13 = uVar13 ^ ((uint)(&pGVar3->field_0x0 + lVar14) & 1 ^
                                    (uint)((ulong)*(undefined8 *)
                                                   ((ulong)(&pGVar3->field_0x0 + lVar14) &
                                                   0xfffffffffffffffe) >> 0x3f)) !=
                                    ((uint)pGVar9 & 1 ^
                                    (uint)((ulong)*(undefined8 *)
                                                   ((ulong)pGVar9 & 0xfffffffffffffffe) >> 0x3f));
                  __s[uVar16] = uVar13;
                  if ((p->pAig->pReprs[uVar16].field_0x3 & 0x10) == 0) {
                    iVar6 = Gia_ManHashXor(p_00,uVar5,uVar13);
                    Gia_ManAppendCo(p_00,iVar6);
                    Vec_IntPush(p->vXorNodes,(uint)p->pAig->pReprs[uVar16] & 0xfffffff);
                    Vec_IntPush(p->vXorNodes,(int)uVar16);
                    iVar6 = *(int *)((long)__ptr +
                                    (ulong)((uint)p->pAig->pReprs[uVar16] & 0xfffffff) * 4);
                    if (iVar6 < iVar15) {
                      iVar6 = iVar15;
                    }
                    *(int *)((long)__ptr + uVar16 * 4) = iVar6 + 1;
                    iVar15 = p->pPars->nDepthMax;
                    if ((iVar15 != 0) && (iVar15 <= iVar6 + 1)) {
                      __s[uVar16] = 0xffffffff;
                    }
                  }
                }
                else {
                  pGVar4 = p->pAig->pReprs;
                  GVar1 = pGVar4[uVar16];
                  uVar12 = (uint)GVar1 ^ (uint)pGVar4[(uint)GVar1 & 0xfffffff];
                  if (p->pPars->fColorDiff == 0) {
                    if (0x3fffffff < uVar12) goto LAB_006558d1;
                  }
                  else if (0xbfffffff < uVar12) goto LAB_006558d1;
                }
              }
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
      pGVar11 = p->pAig;
      lVar17 = lVar17 + 0x100000000;
      lVar14 = lVar14 + 0xc;
    } while ((long)uVar16 < (long)pGVar11->nObjs);
  }
  free(__s);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs limited speculative reduction.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Cec_ManFraSpecReduction( Cec_ManFra_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr = NULL;
    int iRes0, iRes1, iRepr, iNode, iMiter;
    int i, fCompl, * piCopies, * pDepths;
    Gia_ManSetPhase( p->pAig );
    Vec_IntClear( p->vXorNodes );
    if ( p->pPars->nLevelMax )
        Gia_ManLevelNum( p->pAig );
    pNew = Gia_ManStart( Gia_ManObjNum(p->pAig) );
    pNew->pName = Abc_UtilStrsav( p->pAig->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pAig->pName );
    Gia_ManHashAlloc( pNew );
    piCopies = ABC_FALLOC( int, Gia_ManObjNum(p->pAig) );
    pDepths  = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    piCopies[0] = 0;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            piCopies[i] = Gia_ManAppendCi( pNew );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) ) 
            continue;
        if ( piCopies[Gia_ObjFaninId0(pObj,i)] == -1 ||
             piCopies[Gia_ObjFaninId1(pObj,i)] == -1 )
             continue;
        iRes0 = Abc_LitNotCond( piCopies[Gia_ObjFaninId0(pObj,i)], Gia_ObjFaninC0(pObj) );
        iRes1 = Abc_LitNotCond( piCopies[Gia_ObjFaninId1(pObj,i)], Gia_ObjFaninC1(pObj) );
        iNode = piCopies[i] = Gia_ManHashAnd( pNew, iRes0, iRes1 );
        pDepths[i] = Abc_MaxInt( pDepths[Gia_ObjFaninId0(pObj,i)], pDepths[Gia_ObjFaninId1(pObj,i)] );
        if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID || Gia_ObjFailed(p->pAig, i) )
            continue;
        assert( Gia_ObjRepr(p->pAig, i) < i );
        iRepr = piCopies[Gia_ObjRepr(p->pAig, i)];
        if ( iRepr == -1 )
            continue;
        if ( Abc_LitRegular(iNode) == Abc_LitRegular(iRepr) )
            continue;
        if ( p->pPars->nLevelMax && 
            (Gia_ObjLevelId(p->pAig, i)  > p->pPars->nLevelMax || 
             Gia_ObjLevelId(p->pAig, Abc_Lit2Var(iRepr)) > p->pPars->nLevelMax) )
            continue;
        if ( p->pPars->fDualOut )
        {
//            if ( i % 1000 == 0 && Gia_ObjRepr(p->pAig, i) )
//                Gia_ManEquivPrintOne( p->pAig, Gia_ObjRepr(p->pAig, i), 0 );
            if ( p->pPars->fColorDiff )
            {
                if ( !Gia_ObjDiffColors( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
            else
            {
                if ( !Gia_ObjDiffColors2( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
        }
        pRepr = Gia_ManObj( p->pAig, Gia_ObjRepr(p->pAig, i) );
        fCompl = Gia_ObjPhaseReal(pObj) ^ Gia_ObjPhaseReal(pRepr);
        piCopies[i] = Abc_LitNotCond( iRepr, fCompl );
        if ( Gia_ObjProved(p->pAig, i) )
            continue;
        // produce speculative miter
        iMiter = Gia_ManHashXor( pNew, iNode, piCopies[i] );
        Gia_ManAppendCo( pNew, iMiter );
        Vec_IntPush( p->vXorNodes, Gia_ObjRepr(p->pAig, i) );
        Vec_IntPush( p->vXorNodes, i );
        // add to the depth of this node
        pDepths[i] = 1 + Abc_MaxInt( pDepths[i], pDepths[Gia_ObjRepr(p->pAig, i)] );
        if ( p->pPars->nDepthMax && pDepths[i] >= p->pPars->nDepthMax )
            piCopies[i] = -1;
    }
    ABC_FREE( piCopies );
    ABC_FREE( pDepths );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}